

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

FragmentSource * __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::genFragmentShaderSource
          (FragmentSource *__return_storage_ptr__,TextureGatherCase *this,bool requireGpuShader5,
          int numTexCoordComponents,DataType samplerType,string *funcCall,
          bool useNormalizedCoordInput,bool usePixCoord)

{
  Context *this_00;
  DataType dataType;
  char *pcVar1;
  Context *context;
  char *pcVar2;
  undefined7 uVar3;
  string local_2f8;
  allocator<char> local_2d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  allocator<char> local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string fragmentSource;
  string local_78;
  undefined1 local_58 [8];
  string texCoordType;
  bool usePixCoord_local;
  bool useNormalizedCoordInput_local;
  string *funcCall_local;
  int local_20;
  DataType samplerType_local;
  int numTexCoordComponents_local;
  bool requireGpuShader5_local;
  TextureGatherCase *this_local;
  
  texCoordType.field_2._M_local_buf[0xf] = useNormalizedCoordInput;
  texCoordType.field_2._M_local_buf[0xe] = usePixCoord;
  local_20 = numTexCoordComponents;
  samplerType_local._3_1_ = requireGpuShader5;
  _numTexCoordComponents_local = this;
  this_local = (TextureGatherCase *)__return_storage_ptr__;
  de::toString<int>(&local_78,&local_20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,"vec"
                 ,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  pcVar2 = "${GPU_SHADER5_REQUIRE}\n";
  pcVar1 = "";
  if ((samplerType_local._3_1_ & 1) != TYPE_INVALID >> 0x18) {
    pcVar1 = "${GPU_SHADER5_REQUIRE}\n";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,pcVar1,&local_2a9);
  std::operator+(&local_288,"${GLSL_VERSION_DECL}\n",&local_2a8);
  std::operator+(&local_268,&local_288,"\nlayout (location = 0) out mediump ");
  dataType = getSamplerGatherResultType(samplerType);
  pcVar1 = glu::getDataTypeName(dataType);
  std::operator+(&local_248,&local_268,pcVar1);
  std::operator+(&local_228,&local_248," o_color;\n\nin highp ");
  std::operator+(&local_208,&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::operator+(&local_1e8,&local_208," v_texCoord;\n");
  uVar3 = (undefined7)((ulong)pcVar2 >> 8);
  pcVar1 = "";
  if ((texCoordType.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar1 = "in highp vec2 v_normalizedCoord;\n";
  }
  std::operator+(&local_1c8,&local_1e8,pcVar1);
  std::operator+(&local_1a8,&local_1c8,"\nuniform highp ");
  pcVar1 = glu::getDataTypeName(samplerType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,pcVar1,&local_2d1);
  std::operator+(&local_188,&local_1a8,&local_2d0);
  std::operator+(&local_168,&local_188," u_sampler;\n");
  pcVar1 = "";
  if ((texCoordType.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar1 = "uniform highp vec2 u_viewportSize;\n";
  }
  std::operator+(&local_148,&local_168,pcVar1);
  std::operator+(&local_128,&local_148,"\nvoid main(void)\n{\n");
  pcVar1 = (char *)CONCAT71(uVar3,texCoordType.field_2._M_local_buf[0xe]);
  pcVar2 = "";
  if ((texCoordType.field_2._M_local_buf[0xe] & 1U) != 0) {
    pcVar2 = "\tivec2 pixCoord = ivec2(v_normalizedCoord*u_viewportSize);\n";
  }
  std::operator+(&local_108,&local_128,pcVar2);
  std::operator+(&local_e8,&local_108,"\to_color = ");
  std::operator+(&local_c8,&local_e8,funcCall);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 &local_c8,";\n}\n");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  this_00 = (this->super_TestCase).m_context;
  context = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f8,(_anonymous_namespace_ *)this_00,context,pcVar1);
  glu::FragmentSource::FragmentSource(__return_storage_ptr__,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

glu::FragmentSource TextureGatherCase::genFragmentShaderSource (bool			requireGpuShader5,
																int				numTexCoordComponents,
																glu::DataType	samplerType,
																const string&	funcCall,
																bool			useNormalizedCoordInput,
																bool			usePixCoord)
{
	DE_ASSERT(glu::isDataTypeSampler(samplerType));
	DE_ASSERT(de::inRange(numTexCoordComponents, 2, 3));
	DE_ASSERT(!usePixCoord || useNormalizedCoordInput);

	const string texCoordType = "vec" + de::toString(numTexCoordComponents);

	std::string fragmentSource = "${GLSL_VERSION_DECL}\n"
								 + string(requireGpuShader5 ? "${GPU_SHADER5_REQUIRE}\n" : "") +
							   "\n"
							   "layout (location = 0) out mediump " + glu::getDataTypeName(getSamplerGatherResultType(samplerType)) + " o_color;\n"
							   "\n"
							   "in highp " + texCoordType + " v_texCoord;\n"
							   + (useNormalizedCoordInput ? "in highp vec2 v_normalizedCoord;\n" : "") +
							   "\n"
							   "uniform highp " + string(glu::getDataTypeName(samplerType)) + " u_sampler;\n"
							   + (useNormalizedCoordInput ? "uniform highp vec2 u_viewportSize;\n" : "") +
							   "\n"
							   "void main(void)\n"
							   "{\n"
							   + (usePixCoord ? "\tivec2 pixCoord = ivec2(v_normalizedCoord*u_viewportSize);\n" : "") +
							   "	o_color = " + funcCall + ";\n"
								 "}\n";

	return glu::FragmentSource(specializeShader(m_context, fragmentSource.c_str()));
}